

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quasiquote_conversion.cpp
# Opt level: O2

bool __thiscall
skiwi::anon_unknown_26::quasiquote_conversion_visitor::has_splicing
          (quasiquote_conversion_visitor *this,cell *in)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  bool bVar4;
  cell *c_00;
  cell *v;
  value_type *__x;
  vector<skiwi::cell,_std::allocator<skiwi::cell>_> todo;
  cell c;
  vector<skiwi::cell,_std::allocator<skiwi::cell>_> local_98;
  cell local_78;
  
  local_98.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
  super__Vector_impl_data._M_start = (cell *)0x0;
  local_98.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
  super__Vector_impl_data._M_finish = (cell *)0x0;
  local_98.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::push_back(&local_98,(value_type *)this);
  do {
    pcVar2 = local_98.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar1 = local_98.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_98.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_98.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_00247fdd:
      std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::~vector(&local_98);
      return pcVar1 != pcVar2;
    }
    c_00 = local_98.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
    cell::cell(&local_78,c_00);
    local_98.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_98.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
    cell::~cell(local_98.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
                super__Vector_impl_data._M_finish);
    bVar4 = tag_is_comma_atsign((quasiquote_conversion_visitor *)&local_78,c_00);
    pcVar3 = local_78.vec.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (bVar4) {
      cell::~cell(&local_78);
      goto LAB_00247fdd;
    }
    if ((local_78.type == ct_pair) &&
       ((long)local_78.pair.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_78.pair.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
              super__Vector_impl_data._M_start == 0xb0)) {
      std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::push_back
                (&local_98,
                 local_78.pair.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl
                 .super__Vector_impl_data._M_start);
      std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::push_back
                (&local_98,
                 local_78.pair.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl
                 .super__Vector_impl_data._M_start + 1);
    }
    else {
      __x = local_78.vec.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
            super__Vector_impl_data._M_start;
      if (local_78.type == ct_vector) {
        for (; __x != pcVar3; __x = __x + 1) {
          std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::push_back(&local_98,__x);
        }
      }
    }
    cell::~cell(&local_78);
  } while( true );
}

Assistant:

bool has_splicing(const cell& in)
      {
      std::vector<cell> todo;
      todo.push_back(in);
      while (!todo.empty())
        {
        cell c = todo.back();
        todo.pop_back();
        if (tag_is_comma_atsign(c))
          return true;
        if (is_pair(c))
          {
          todo.push_back(c.pair[0]);
          todo.push_back(c.pair[1]);
          }
        else if (c.type == ct_vector)
          {
          for (const auto& v : c.vec)
            todo.push_back(v);
          }
        }
      return false;
      }